

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O2

int wiz_show_rooms(void)

{
  nh_menuitem *pnVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  menulist menu;
  char row [81];
  
  init_menulist(&menu);
  lVar7 = 0x46;
  for (lVar8 = 0; lVar8 != 0x15; lVar8 = lVar8 + 1) {
    pcVar3 = level->levname + lVar7;
    for (lVar5 = 0; lVar5 != 0x50; lVar5 = lVar5 + 1) {
      uVar4 = *(ushort *)(pcVar3 + 2) & 0x3f;
      if (uVar4 < 3) {
        cVar6 = (char)(0x2a2b2e >> ((byte)(uVar4 << 3) & 0x1f));
      }
      else {
        uVar2 = uVar4 - 0x37;
        if (uVar4 - 3 < 0x34) {
          uVar2 = uVar4 - 3;
        }
        cVar6 = (uVar2 < 0x1a) * ' ' + (char)uVar2 + 'A';
      }
      row[lVar5] = cVar6;
      pcVar3 = pcVar3 + 0xfc;
    }
    row[0x50] = '\0';
    lVar5 = (long)menu.size;
    if (menu.size <= menu.icount) {
      menu.size = menu.size * 2;
      menu.items = (nh_menuitem *)realloc(menu.items,lVar5 * 0x218);
    }
    pnVar1 = menu.items + menu.icount;
    pnVar1->id = 0;
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,row);
    menu.icount = menu.icount + 1;
    lVar7 = lVar7 + 0xc;
  }
  display_menu(menu.items,menu.icount,(char *)0x0,0,(int *)0x0);
  free(menu.items);
  return 0;
}

Assistant:

static int wiz_show_rooms(void)
{
	struct menulist menu;
	int x, y;
	char row[COLNO+1];

	init_menulist(&menu);

	for (y = 0; y < ROWNO; y++) {
	    for (x = 0; x < COLNO; x++) {
		int rno = level->locations[x][y].roomno;
		if (rno == NO_ROOM) {
		    row[x] = '.';
		} else if (rno == SHARED) {
		    row[x] = '+';
		} else if (rno == SHARED_PLUS) {
		    row[x] = '*';
		} else {
		    int i = (rno - ROOMOFFSET) % 52;
		    row[x] = (i < 26) ? ('a' + i) : ('A' + i);
		}
	    }
	    row[COLNO] = '\0';
	    add_menutext(&menu, row);
	}
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
	return 0;
}